

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Editor.cxx
# Opt level: O2

int Fl_Text_Editor::kf_ctrl_move(int c,Fl_Text_Editor *e)

{
  Fl_Text_Buffer *this;
  int iVar1;
  int topLineNum;
  
  this = (e->super_Fl_Text_Display).mBuffer;
  if ((this->mPrimary).mSelected == false) {
    (e->super_Fl_Text_Display).dragPos = (e->super_Fl_Text_Display).mCursorPos;
  }
  if (c == 0xff52) {
    iVar1 = (e->super_Fl_Text_Display).mHorizOffset;
    topLineNum = (e->super_Fl_Text_Display).mTopLineNum + -1;
    goto LAB_001d1e4c;
  }
  if (c == 0xff54) {
    iVar1 = (e->super_Fl_Text_Display).mHorizOffset;
    topLineNum = (e->super_Fl_Text_Display).mTopLineNum + 1;
    goto LAB_001d1e4c;
  }
  Fl_Text_Buffer::unselect(this);
  Fl::copy((EVP_PKEY_CTX *)0x20b10a,(EVP_PKEY_CTX *)0x0);
  Fl_Text_Display::show_insert_position(&e->super_Fl_Text_Display);
  switch(c) {
  case 0xff50:
    Fl_Text_Display::insert_position(&e->super_Fl_Text_Display,0);
    topLineNum = 0;
    goto LAB_001d1edf;
  case 0xff51:
    Fl_Text_Display::previous_word(&e->super_Fl_Text_Display);
    break;
  case 0xff53:
    Fl_Text_Display::next_word(&e->super_Fl_Text_Display);
    break;
  case 0xff55:
    iVar1 = *(e->super_Fl_Text_Display).mLineStarts;
    goto LAB_001d1f10;
  case 0xff56:
    iVar1 = (e->super_Fl_Text_Display).mLineStarts
            [(long)(e->super_Fl_Text_Display).mNVisibleLines + -2];
LAB_001d1f10:
    Fl_Text_Display::insert_position(&e->super_Fl_Text_Display,iVar1);
    break;
  case 0xff57:
    Fl_Text_Display::insert_position
              (&e->super_Fl_Text_Display,((e->super_Fl_Text_Display).mBuffer)->mLength);
    topLineNum = Fl_Text_Display::count_lines
                           (&e->super_Fl_Text_Display,0,
                            ((e->super_Fl_Text_Display).mBuffer)->mLength,true);
LAB_001d1edf:
    iVar1 = 0;
LAB_001d1e4c:
    Fl_Text_Display::scroll(&e->super_Fl_Text_Display,topLineNum,iVar1);
  }
  return 1;
}

Assistant:

int Fl_Text_Editor::kf_ctrl_move(int c, Fl_Text_Editor* e) {
  if (!e->buffer()->selected())
    e->dragPos = e->insert_position();
  if (c != FL_Up && c != FL_Down) {
    e->buffer()->unselect();
    Fl::copy("", 0, 0);
    e->show_insert_position();
  }
  switch (c) {
    case FL_Home:
      e->insert_position(0);
      e->scroll(0, 0);
      break;
    case FL_End:
      e->insert_position(e->buffer()->length());
      e->scroll(e->count_lines(0, e->buffer()->length(), 1), 0);
      break;
    case FL_Left:
      e->previous_word();
      break;
    case FL_Right:
      e->next_word();
      break;
    case FL_Up:
      e->scroll(e->mTopLineNum-1, e->mHorizOffset);
      break;
    case FL_Down:
      e->scroll(e->mTopLineNum+1, e->mHorizOffset);
      break;
    case FL_Page_Up:
      e->insert_position(e->mLineStarts[0]);
      break;
    case FL_Page_Down:
      e->insert_position(e->mLineStarts[e->mNVisibleLines-2]);
      break;
  }
  return 1;
}